

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O3

void EmitWords(int *words,bool isInstructionStart)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  
  iVar3 = *words;
  if (iVar3 != -1) {
    piVar2 = words + 1;
    do {
      iVar1 = iVar3 + 0xff;
      if (-1 < iVar3) {
        iVar1 = iVar3;
      }
      EmitByte(iVar3 % 0x100,(bool)(isInstructionStart & 1));
      isInstructionStart = false;
      EmitByte(iVar1 >> 8,false);
      iVar3 = *piVar2;
      piVar2 = piVar2 + 1;
    } while (iVar3 != -1);
  }
  return;
}

Assistant:

void EmitWords(const int* words, bool isInstructionStart) {
	while (BYTES_END_MARKER != *words) {
		EmitWord(*words++, isInstructionStart);
		isInstructionStart = false;		// only true for first word
	}
}